

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetObjectsNode::Evaluate
          (string *__return_storage_ptr__,TargetObjectsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  string *psVar1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *this_00;
  pointer pbVar3;
  bool bVar4;
  TargetType TVar5;
  int iVar6;
  cmGeneratorTarget *this_01;
  ostream *poVar7;
  _Alloc_hider _Var8;
  string *__return_storage_ptr___00;
  string *o;
  pointer pbVar9;
  string *o_1;
  string_view separator;
  string_view arg;
  cmValue imp;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  string *local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string reason;
  string local_1c8;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  psVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,psVar1);
  if (this_01 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar7 = std::operator<<((ostream *)&e,"Objects of target \"");
    poVar7 = std::operator<<(poVar7,(string *)psVar1);
    std::operator<<(poVar7,"\" referenced but no such target exists.");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&reason,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&reason,(string *)&imp);
  }
  else {
    TVar5 = cmGeneratorTarget::GetType(this_01);
    if (TVar5 < UTILITY) {
      pcVar2 = context->LG->GlobalGenerator;
      reason._M_dataplus._M_p = (pointer)&reason.field_2;
      reason._M_string_length = 0;
      reason.field_2._M_local_buf[0] = '\0';
      local_220 = __return_storage_ptr__;
      if ((context->EvaluateForBuildsystem == false) &&
         (bVar4 = cmTarget::HasKnownObjectFileLocation(this_01->Target,&reason), !bVar4)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar7 = std::operator<<((ostream *)&e,
                                 "The evaluation of the TARGET_OBJECTS generator expression is only suitable for consumption by CMake (limited"
                                );
        psVar1 = local_220;
        poVar7 = std::operator<<(poVar7,(string *)&reason);
        std::operator<<(poVar7,").  It is not suitable for writing out elsewhere.");
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&imp,content);
        std::__cxx11::stringbuf::str();
        reportError(context,(string *)&imp,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&imp);
        (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
        psVar1->_M_string_length = 0;
        (psVar1->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::__cxx11::string::~string((string *)&reason);
        return psVar1;
      }
      std::__cxx11::string::~string((string *)&reason);
      objects.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      objects.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      objects.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = cmGeneratorTarget::IsImported(this_01);
      if (bVar4) {
        reason._M_dataplus._M_p = (pointer)0x0;
        imp.Value = (string *)0x0;
        _e = (pointer)local_198;
        local_198[0]._M_local_buf[0] = '\0';
        bVar4 = cmTarget::GetMappedConfig
                          (this_01->Target,&context->Config,(cmValue *)&reason,&imp,(string *)&e);
        __return_storage_ptr___00 = local_220;
        if (bVar4) {
          _Var8 = reason._M_dataplus;
          if (reason._M_dataplus._M_p == (pointer)0x0) {
            _Var8._M_p = (pointer)&cmValue::Empty_abi_cxx11_;
          }
          arg._M_str = (((string *)_Var8._M_p)->_M_dataplus)._M_p;
          arg._M_len = ((string *)_Var8._M_p)->_M_string_length;
          cmExpandList(arg,&objects,false);
        }
        context->HadContextSensitiveCondition = true;
        std::__cxx11::string::~string((string *)&e);
      }
      else {
        cmGeneratorTarget::GetTargetObjectNames(this_01,&context->Config,&objects);
        imp.Value = (string *)&local_230;
        local_230._M_local_buf[0] = '\0';
        if ((context->EvaluateForBuildsystem == true) &&
           (iVar6 = (*pcVar2->_vptr_cmGlobalGenerator[0x35])(pcVar2), (char)iVar6 == '\0')) {
          std::__cxx11::string::_M_assign((string *)&imp);
          bVar4 = cmGeneratorTarget::HasContextDependentSources(this_01);
          context->HadContextSensitiveCondition = bVar4;
        }
        else {
          cmGeneratorTarget::GetObjectDirectory((string *)&e,this_01,&context->Config);
          std::__cxx11::string::operator=((string *)&imp,(string *)&e);
          std::__cxx11::string::~string((string *)&e);
          context->HadContextSensitiveCondition = true;
        }
        pbVar3 = objects.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar9 = objects.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar3;
            pbVar9 = pbVar9 + 1) {
          _e = (pointer)0x0;
          reason._M_string_length = (size_type)(pbVar9->_M_dataplus)._M_p;
          reason._M_dataplus._M_p = (pointer)pbVar9->_M_string_length;
          cmStrCat<>(&local_1c8,(cmAlphaNum *)&e,(cmAlphaNum *)&reason);
          std::__cxx11::string::operator=((string *)pbVar9,(string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        std::__cxx11::string::~string((string *)&imp);
        __return_storage_ptr___00 = local_220;
      }
      pbVar3 = objects.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      this_00 = context->LG->Makefile;
      for (pbVar9 = objects.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar3; pbVar9 = pbVar9 + 1
          ) {
        cmMakefile::AddTargetObject(this_00,psVar1,pbVar9);
      }
      separator._M_str = ";";
      separator._M_len = 1;
      cmJoin(__return_storage_ptr___00,&objects,separator,(string_view)ZEXT816(0));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&objects);
      return __return_storage_ptr___00;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar7 = std::operator<<((ostream *)&e,"Objects of target \"");
    poVar7 = std::operator<<(poVar7,(string *)psVar1);
    poVar7 = std::operator<<(poVar7,"\" referenced but is not one of the allowed target types ");
    std::operator<<(poVar7,"(EXECUTABLE, STATIC, SHARED, MODULE, OBJECT).");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&reason,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&reason,(string *)&imp);
  }
  std::__cxx11::string::~string((string *)&imp);
  std::__cxx11::string::~string((string *)&reason);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    std::string const& tgtName = parameters.front();
    cmGeneratorTarget* gt = context->LG->FindGeneratorTargetToUse(tgtName);
    if (!gt) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    cmStateEnums::TargetType type = gt->GetType();
    if (type != cmStateEnums::EXECUTABLE &&
        type != cmStateEnums::STATIC_LIBRARY &&
        type != cmStateEnums::SHARED_LIBRARY &&
        type != cmStateEnums::MODULE_LIBRARY &&
        type != cmStateEnums::OBJECT_LIBRARY) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not one of the allowed target types "
        << "(EXECUTABLE, STATIC, SHARED, MODULE, OBJECT).";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
    {
      std::string reason;
      if (!context->EvaluateForBuildsystem &&
          !gt->Target->HasKnownObjectFileLocation(&reason)) {
        std::ostringstream e;
        e << "The evaluation of the TARGET_OBJECTS generator expression "
             "is only suitable for consumption by CMake (limited"
          << reason
          << ").  "
             "It is not suitable for writing out elsewhere.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
    }

    std::vector<std::string> objects;

    if (gt->IsImported()) {
      cmValue loc = nullptr;
      cmValue imp = nullptr;
      std::string suffix;
      if (gt->Target->GetMappedConfig(context->Config, loc, imp, suffix)) {
        cmExpandList(*loc, objects);
      }
      context->HadContextSensitiveCondition = true;
    } else {
      gt->GetTargetObjectNames(context->Config, objects);

      std::string obj_dir;
      if (context->EvaluateForBuildsystem && !gg->SupportsCrossConfigs()) {
        // Use object file directory with buildsystem placeholder.
        obj_dir = gt->ObjectDirectory;
        context->HadContextSensitiveCondition =
          gt->HasContextDependentSources();
      } else {
        // Use object file directory with per-config location.
        obj_dir = gt->GetObjectDirectory(context->Config);
        context->HadContextSensitiveCondition = true;
      }

      for (std::string& o : objects) {
        o = cmStrCat(obj_dir, o);
      }
    }

    // Create the cmSourceFile instances in the referencing directory.
    cmMakefile* mf = context->LG->GetMakefile();
    for (std::string const& o : objects) {
      mf->AddTargetObject(tgtName, o);
    }

    return cmJoin(objects, ";");
  }